

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::operator-(SVInt *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  SVInt SVar2;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  undefined8 uVar1;
  
  if (*(char *)(in_RSI + 0xd) == '\x01') {
    SVar2 = createFillX(this,*(bitwidth_t *)(in_RSI + 8),*(bool *)(in_RSI + 0xc));
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  else {
    SVInt((SVInt *)&local_28,*(bitwidth_t *)(in_RSI + 8),0,*(bool *)(in_RSI + 0xc));
    SVar2 = operator-(this,(SVInt *)&local_28);
    uVar1 = SVar2.super_SVIntStorage._8_8_;
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
      uVar1 = extraout_RDX;
    }
  }
  SVar2.super_SVIntStorage.bitWidth = (int)uVar1;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar1 >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar1 >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)uVar1 >> 0x30);
  SVar2.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator-() const {
    if (unknownFlag)
        return createFillX(bitWidth, signFlag);
    return SVInt(bitWidth, 0, signFlag) - *this;
}